

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::M68k::Primitive::negative<true,unsigned_short>
               (unsigned_short *source,Status *status)

{
  ushort uVar1;
  uint uVar2;
  unsigned_short input_differed;
  unsigned_short output_changed;
  ulong uVar3;
  
  uVar1 = *source;
  uVar2 = -(uint)uVar1 - (uint)(status->extend_flag != 0);
  uVar3 = (ulong)(uVar2 & 0xffff);
  status->zero_result = status->zero_result | uVar3;
  status->carry_flag = uVar3;
  status->extend_flag = uVar3;
  status->negative_flag = (ulong)(uVar2 & 0x8000);
  status->overflow_flag = (ulong)(uVar2 & 0x8000 & (uint)uVar1);
  *source = (unsigned_short)uVar2;
  return;
}

Assistant:

void negative(IntT &source, Status &status) {
	const IntT result = -source - (is_extend && status.extend_flag ? 1 : 0);

	if constexpr (is_extend) {
		status.zero_result |= result;
	} else {
		status.zero_result = result;
	}
	status.extend_flag = status.carry_flag = result;	// i.e. any value other than 0 will result in carry.
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<false>(IntT(0), source, result);

	source = result;
}